

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSSerializerImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMLSSerializerImpl::ensureValidString
          (DOMLSSerializerImpl *this,DOMNode *nodeToWrite,XMLCh *string)

{
  byte bVar1;
  XMLCh toCheck;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  
  if (string != (XMLCh *)0x0) {
    while( true ) {
      toCheck = *string;
      uVar4 = (ulong)(ushort)toCheck;
      if (uVar4 == 0) break;
      bVar3 = this->fIsXml11;
      if ((bool)bVar3 == true) {
        bVar1 = (&XMLChar1_1::fgCharCharsTable1_1)[uVar4];
      }
      else {
        bVar1 = (&XMLChar1_0::fgCharCharsTable1_0)[uVar4];
      }
      if ((bVar1 & 0x40) == 0) {
        if ((toCheck & 0xfc00U) == 0xd800) {
          if (string[1] == L'\0') {
LAB_0028d5b1:
            reportError(this,nodeToWrite,DOM_SEVERITY_FATAL_ERROR,INVALID_CHARACTER_ERR);
            return;
          }
          if ((bool)bVar3 != false) {
            bVar2 = XMLChar1_1::isXMLChar(toCheck,string[1]);
            if (!bVar2) goto LAB_0028d5b1;
            bVar3 = this->fIsXml11;
          }
          string = string + 1;
          if (((bVar3 & 1) == 0) && (bVar2 = XMLChar1_0::isXMLChar(toCheck,*string), !bVar2))
          goto LAB_0028d5b1;
        }
        else {
          reportError(this,nodeToWrite,DOM_SEVERITY_FATAL_ERROR,INVALID_CHARACTER_ERR);
        }
      }
      string = string + 1;
    }
  }
  return;
}

Assistant:

void DOMLSSerializerImpl::ensureValidString(const DOMNode* nodeToWrite, const XMLCh* string)
{
    // XERCESC-1854: prevent illegal characters from being written
    // XERCESC-2130: allow surrogates
    if(string==0)
        return;
    const XMLCh* cursor=string;
    while(*cursor!=0)
    {
        if((fIsXml11 && !XMLChar1_1::isXMLChar(*cursor)) || (!fIsXml11 && !XMLChar1_0::isXMLChar(*cursor)))
        {
            if((*cursor >= 0xD800) && (*cursor <= 0xDBFF))
            {
                XMLCh leadingSurrogate = *cursor;
                cursor++;
                if(0==*cursor || (fIsXml11 && !XMLChar1_1::isXMLChar(leadingSurrogate, *cursor)) || (!fIsXml11 && !XMLChar1_0::isXMLChar(leadingSurrogate, *cursor)))
                {
                    reportError(nodeToWrite, DOMError::DOM_SEVERITY_FATAL_ERROR, XMLDOMMsg::INVALID_CHARACTER_ERR);
                    return; // leave if reportError does not throw
                }
            }
            else
            {
                reportError(nodeToWrite, DOMError::DOM_SEVERITY_FATAL_ERROR, XMLDOMMsg::INVALID_CHARACTER_ERR);
            }
        }
        cursor++;
    }
}